

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result.hpp
# Opt level: O2

iu_ostream * iutest::operator<<(iu_ostream *os,TestPartResult *result)

{
  ostream *poVar1;
  string local_30;
  
  detail::iuCodeMessage::make_message_abi_cxx11_(&local_30,&result->super_iuCodeMessage);
  poVar1 = std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

inline iu_ostream& operator << (iu_ostream& os, const TestPartResult& result)
{
    return os << result.make_message();
}